

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

bool __thiscall
NativeCodeGenerator::Process(NativeCodeGenerator *this,Job *job,ParallelThreadData *threadData)

{
  code *pcVar1;
  CodeGenWorkItemType CVar2;
  bool bVar3;
  ThreadContext *this_00;
  FunctionBody *this_01;
  LoopEntryPointInfo *this_02;
  EntryPointInfo *this_03;
  undefined4 *puVar4;
  bool bVar5;
  CodeGenWorkItem *local_70;
  EntryPointInfo *entryPoint;
  FunctionBody *fn;
  JsLoopBodyCodeGen *loopBodyCodeGenWorkItem;
  CodeGenWorkItem *codeGenWork;
  PageAllocator *pageAllocator;
  bool foreground;
  ParallelThreadData *threadData_local;
  Job *job_local;
  NativeCodeGenerator *this_local;
  
  bVar5 = threadData == (ParallelThreadData *)0x0;
  if (bVar5) {
    this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
    codeGenWork = (CodeGenWorkItem *)ThreadContext::GetPageAllocator(this_00);
  }
  else {
    codeGenWork = (CodeGenWorkItem *)JsUtil::ParallelThreadData::GetPageAllocator(threadData);
  }
  if (job == (Job *)0x0) {
    local_70 = (CodeGenWorkItem *)0x0;
  }
  else {
    local_70 = (CodeGenWorkItem *)&job[-1].isCritical;
  }
  CVar2 = CodeGenWorkItem::Type(local_70);
  if (CVar2 == JsFunctionType) {
    if ((((DAT_01eb89ea & 1) == 0) && ((DAT_01ea9f0a & 1) == 0)) &&
       (bVar3 = WorkItemExceedsJITLimits(local_70), bVar3)) {
      job->failureReason = ExceedJITLimit;
      return false;
    }
    CodeGen(this,(PageAllocator *)codeGenWork,local_70,bVar5);
    return true;
  }
  if (CVar2 != JsLoopBodyWorkItemType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x782,"((0))","(0)");
    if (bVar5) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      job->failureReason = Unknown;
      return false;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_01 = CodeGenWorkItem::GetFunctionBody(local_70);
  bVar3 = Js::FunctionBody::GetNativeEntryPointUsed(this_01);
  if ((bVar3) && (bVar3 = Js::FunctionBody::GetCanReleaseLoopHeaders(this_01), bVar3)) {
    bVar3 = Js::FunctionBody::GetIsAsmJsFunction(this_01);
    if (bVar3) {
      this_02 = Js::LoopHeader::GetCurrentEntryPointInfo
                          ((LoopHeader *)
                           local_70[1].super_Job.
                           super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                           previous);
      bVar3 = Js::EntryPointInfo::GetIsTJMode(&this_02->super_EntryPointInfo);
      if (bVar3) goto LAB_00801333;
    }
    Js::LoopHeader::ResetInterpreterCount
              ((LoopHeader *)
               local_70[1].super_Job.
               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous);
    this_local._7_1_ = false;
  }
  else {
LAB_00801333:
    bVar3 = Js::FunctionBody::ForceJITLoopBody(this_01);
    if ((bVar3) || (bVar3 = WorkItemExceedsJITLimits(local_70), !bVar3)) {
      CodeGen(this,(PageAllocator *)codeGenWork,local_70,bVar5);
      this_local._7_1_ = true;
    }
    else {
      this_03 = CodeGenWorkItem::GetEntryPoint(local_70);
      Js::EntryPointInfo::SetJITCapReached(this_03);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
NativeCodeGenerator::Process(JsUtil::Job *const job, JsUtil::ParallelThreadData *threadData)
{
    const bool foreground = !threadData;
    PageAllocator *pageAllocator;
    if (foreground)
    {
        pageAllocator = scriptContext->GetThreadContext()->GetPageAllocator();
    }
    else
    {
        pageAllocator = threadData->GetPageAllocator();
    }

    CodeGenWorkItem *const codeGenWork = static_cast<CodeGenWorkItem *>(job);

    switch (codeGenWork->Type())
    {
    case JsLoopBodyWorkItemType:
    {
        JsLoopBodyCodeGen* loopBodyCodeGenWorkItem = (JsLoopBodyCodeGen*)codeGenWork;
        Js::FunctionBody* fn = loopBodyCodeGenWorkItem->GetFunctionBody();

        if (fn->GetNativeEntryPointUsed() && fn->GetCanReleaseLoopHeaders()
#ifdef ASMJS_PLAT
            && (!fn->GetIsAsmJsFunction() || !(loopBodyCodeGenWorkItem->loopHeader->GetCurrentEntryPointInfo()->GetIsTJMode()))
#endif
        )
        {
            loopBodyCodeGenWorkItem->loopHeader->ResetInterpreterCount();
            return false;
        }
        // Unless we're in a ForceNative configuration, ignore this workitem if it exceeds JIT limits
        if (fn->ForceJITLoopBody() || !WorkItemExceedsJITLimits(codeGenWork))
        {
            CodeGen(pageAllocator, codeGenWork, foreground);
            return true;
        }
        Js::EntryPointInfo * entryPoint = loopBodyCodeGenWorkItem->GetEntryPoint();
        entryPoint->SetJITCapReached();
        return false;
    }
    case JsFunctionType:
    {
        // Unless we're in a ForceNative configuration, ignore this workitem if it exceeds JIT limits
        if (IS_PREJIT_ON() || Js::Configuration::Global.flags.ForceNative || !WorkItemExceedsJITLimits(codeGenWork))
        {
            CodeGen(pageAllocator, codeGenWork, foreground);
            return true;
        }
#if ENABLE_DEBUG_CONFIG_OPTIONS
        job->failureReason = Job::FailureReason::ExceedJITLimit;
#endif
        return false;
    }

    default:
        Assume(UNREACHED);
    }
#if ENABLE_DEBUG_CONFIG_OPTIONS
    job->failureReason = Job::FailureReason::Unknown;
#endif
    return false;
}